

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileWriter.cpp
# Opt level: O0

void __thiscall WriterData::execute(WriterData *this)

{
  WriterData *this_local;
  
  if (this->m_command == wdWrite) {
    if (this->m_mainFile != (AbstractOutputStream *)0x0) {
      (*(this->m_mainFile->super_AbstractStream)._vptr_AbstractStream[5])
                (this->m_mainFile,this->m_buffer,(ulong)(uint)this->m_bufferLen);
    }
    if (this->m_buffer != (uint8_t *)0x0) {
      operator_delete__(this->m_buffer);
    }
  }
  return;
}

Assistant:

void WriterData::execute() const
{
    switch (m_command)
    {
    case Commands::wdWrite:
        if (m_mainFile)
        {
            m_mainFile->write(m_buffer, m_bufferLen);
        }
        delete[] m_buffer;
        break;
    default:
        break;
    }
}